

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

int __thiscall MovDemuxer::mov_read_wide(MovDemuxer *this,MOVAtom atom)

{
  MOVAtom atom_00;
  undefined4 uVar1;
  int64_t iVar2;
  uint uVar3;
  int err;
  MovDemuxer *this_local;
  
  uVar1 = atom._4_4_;
  iVar2 = atom.offset;
  if (atom.size < 8) {
    this_local._4_4_ = 0;
  }
  else {
    uVar3 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    if (uVar3 == 0) {
      uVar3 = IOContextDemuxer::get_le32(&this->super_IOContextDemuxer);
      atom._0_16_ = atom._0_16_;
      atom.type = uVar3;
      atom.offset = iVar2 + 8;
      if ((undefined1  [16])atom._0_16_ == (undefined1  [16])0x7461646d) {
        atom_00._4_4_ = uVar1;
        atom_00.type = 0x7461646d;
        atom_00.offset = iVar2 + 8;
        atom_00.size = atom.size - 8U;
        this_local._4_4_ = mov_read_mdat(this,atom_00);
      }
      else {
        IOContextDemuxer::skip_bytes(&this->super_IOContextDemuxer,atom.size - 8U);
        this_local._4_4_ = 0;
      }
    }
    else {
      IOContextDemuxer::skip_bytes(&this->super_IOContextDemuxer,atom.size - 4);
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int MovDemuxer::mov_read_wide(MOVAtom atom)
{
    if (atom.size < 8)
        return 0;  // continue
    if (get_be32() != 0)
    {  // 0 sized mdat atom... use the 'wide' atom size
        skip_bytes(atom.size - 4);
        return 0;
    }
    atom.type = get_le32();
    atom.offset += 8;
    atom.size -= 8;
    if (atom.type != MKTAG('m', 'd', 'a', 't'))
    {
        skip_bytes(atom.size);
        return 0;
    }
    const int err = mov_read_mdat(atom);
    return err;
}